

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

domain_manager * __thiscall
cs::domain_manager::add_buildin_type<char_const(&)[6]>
          (domain_manager *this,char (*name) [6],function<cs_impl::any_()> *func,type_index *id,
          namespace_t *ext)

{
  size_t sVar1;
  size_t hashval;
  domain_manager *pdVar2;
  char (*key) [6];
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  sVar1 = strlen(*name);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,*name + sVar1);
  add_record(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p =
       (pointer)&(this->buildin_symbols).
                 super_raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .settings_;
  hashval = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::HashElement::operator()((HashElement *)&local_50,name);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::emplace_decomposable<char[6],char_const(&)[6]>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
              *)&local_50,
             (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->buildin_symbols,name,hashval,name);
  cs_impl::any::
  make_protect<cs::type_t,std::function<cs_impl::any()>const&,std::type_index_const&,std::shared_ptr<cs::name_space>&>
            ((any *)&local_50,func,id,ext);
  pdVar2 = add_var<char_const(&)[6]>(this,name,(var *)&local_50);
  cs_impl::any::recycle((any *)&local_50);
  return pdVar2;
}

Assistant:

domain_manager &
		add_buildin_type(T &&name, const std::function<var()> &func, const std::type_index &id, namespace_t ext)
		{
			add_record(name);
			buildin_symbols.emplace(name);
			return add_var(name, var::make_protect<type_t>(func, id, ext));
		}